

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# snestistics.cpp
# Opt level: O1

void branch_report(ReportWriter *writer,RomAccessor *rom,Trace *op_trace,
                  AnnotationResolver *annotations)

{
  _Rb_tree_color p;
  AnnotationResolver *this;
  byte bVar1;
  int iVar2;
  int iVar3;
  uint resolve_adress;
  Annotation *target_annotation;
  Annotation *source_annotation;
  StringBuilder sb;
  Annotation *local_1070;
  RomAccessor *local_1068;
  Annotation *local_1060;
  _Base_ptr local_1058;
  _Base_ptr local_1050;
  ReportWriter *local_1048;
  AnnotationResolver *local_1040;
  StringBuilder local_1034;
  
  local_1068 = rom;
  local_1040 = annotations;
  memset(&local_1034,0,0x1004);
  ReportWriter::writeSeperator(writer,"Branch analysis");
  ReportWriter::writeComment
            (writer,
             "NOTE: Branches between two functions could mean that they really are one function.");
  ReportWriter::writeComment
            (writer,
             "      Branches out from a function could mean that the function is larger than tagged."
            );
  ReportWriter::writeComment
            (writer,"      This report was generated AFTER extra branches were predicted.");
  local_1048 = writer;
  ReportWriter::writeComment(writer,"");
  local_1034._length = 0;
  local_1034._backing[0] = '\0';
  local_1050 = (op_trace->ops)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_1058 = &(op_trace->ops)._M_t._M_impl.super__Rb_tree_header._M_header;
  if (local_1050 != local_1058) {
    do {
      p = local_1050[1]._M_color;
      bVar1 = snestistics::RomAccessor::evalByte(local_1068,p);
      if ((&snestistics::branches)[bVar1] == '\x01') {
        iVar3 = 1;
        do {
          resolve_adress = p + 2;
          if (iVar3 == 1) {
            bVar1 = snestistics::RomAccessor::evalByte(local_1068,p + _S_black);
            resolve_adress = (p - 0xfe) + (uint)bVar1;
            if (-1 < (char)bVar1) {
              resolve_adress = (uint)bVar1 + p + 2;
            }
          }
          this = local_1040;
          iVar3 = iVar3 + -1;
          local_1060 = (Annotation *)0x0;
          local_1070 = (Annotation *)0x0;
          snestistics::AnnotationResolver::resolve_annotation
                    (local_1040,p,&local_1060,(Annotation **)0x0);
          snestistics::AnnotationResolver::resolve_annotation
                    (this,resolve_adress,&local_1070,(Annotation **)0x0);
          iVar2 = 6;
          if ((local_1060 != (Annotation *)0x0) && (local_1060 != local_1070)) {
            local_1034._length = 0;
            local_1034._backing[0] = '\0';
            snestistics::StringBuilder::format
                      (&local_1034,"Branch going from %s",(local_1060->name)._M_dataplus._M_p);
            if (local_1070 != (Annotation *)0x0) {
              snestistics::StringBuilder::format
                        (&local_1034," to %s",(local_1070->name)._M_dataplus._M_p);
            }
            iVar2 = 0;
            snestistics::StringBuilder::format
                      (&local_1034," [%06X->%06X]",(ulong)p,(ulong)resolve_adress);
            ReportWriter::writeComment(local_1048,&local_1034);
          }
        } while (((iVar2 == 6) || (iVar2 == 0)) && (iVar3 == 0));
      }
      local_1050 = (_Base_ptr)std::_Rb_tree_increment(local_1050);
    } while (local_1050 != local_1058);
  }
  return;
}

Assistant:

void branch_report(ReportWriter &writer, const RomAccessor &rom, const Trace &op_trace, const AnnotationResolver &annotations) {
	StringBuilder sb;
	writer.writeSeperator("Branch analysis");
	writer.writeComment("NOTE: Branches between two functions could mean that they really are one function.");
	writer.writeComment("      Branches out from a function could mean that the function is larger than tagged.");
	writer.writeComment("      This report was generated AFTER extra branches were predicted.");
	writer.writeComment("");

	sb.clear();

	for (const auto &it : op_trace.ops) {
		const Pointer pc = it.first;
		uint8_t opcode = rom.evalByte(pc);
		if (!branches[opcode])
			continue;

		for (int myloop = 0; myloop < 2; myloop++) {
			Pointer target = myloop == 0 ? branch8(pc, rom.evalByte(pc+1)) : pc + 2;
			if (myloop == 1 && opcode == 0x80)
				break;

			const Annotation *source_annotation = nullptr, *target_annotation = nullptr;
			annotations.resolve_annotation(pc,     &source_annotation);
			annotations.resolve_annotation(target, &target_annotation);

			if (!source_annotation || source_annotation == target_annotation)
				continue;

			sb.clear();
			sb.format("Branch going from %s", source_annotation->name.c_str());
						
			if (target_annotation) {
				sb.format(" to %s", target_annotation->name.c_str());
			}
			sb.format(" [%06X->%06X]", pc, target);
			writer.writeComment(sb);
		}
	}
}